

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

string * __thiscall
duckdb::FormatOptionLine<std::__cxx11::string>
          (string *__return_storage_ptr__,duckdb *this,string *name,
          CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *option)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,*(long *)this,*(long *)(this + 8) + *(long *)this);
  ::std::__cxx11::string::append((char *)&local_88);
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,name->_M_string_length,
             (name->field_2)._M_allocated_capacity + name->_M_string_length);
  uVar7 = 0xf;
  if (local_88 != local_78) {
    uVar7 = local_78[0];
  }
  if (uVar7 < (ulong)(local_40 + local_80)) {
    uVar7 = 0xf;
    if (local_48 != local_38) {
      uVar7 = local_38[0];
    }
    if (uVar7 < (ulong)(local_40 + local_80)) goto LAB_0152cf68;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_88);
  }
  else {
LAB_0152cf68:
    puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48);
  }
  local_e8 = &local_d8;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_d8 = *puVar1;
    uStack_d0 = puVar3[3];
  }
  else {
    local_d8 = *puVar1;
    local_e8 = (undefined8 *)*puVar3;
  }
  local_e0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_e8);
  puVar5 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar5) {
    local_98 = *puVar5;
    lStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar5;
    local_a8 = (ulong *)*plVar4;
  }
  local_a0 = plVar4[1];
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FormatSet(&local_68,
            (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)name);
  uVar7 = 0xf;
  if (local_a8 != &local_98) {
    uVar7 = local_98;
  }
  if (uVar7 < local_68._M_string_length + local_a0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar8 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_a0 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0152d09f;
    }
  }
  puVar3 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
LAB_0152d09f:
  local_c8 = &local_b8;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_b8 = *puVar1;
    uStack_b0 = puVar3[3];
  }
  else {
    local_b8 = *puVar1;
    local_c8 = (undefined8 *)*puVar3;
  }
  local_c0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

string FormatOptionLine(const string &name, const CSVOption<T> &option) {
	return name + " = " + option.FormatValue() + " " + option.FormatSet() + "\n  ";
}